

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void stresshashfunction<EasyUseSparseHashMap<HashObject<8,8>*,int,HashFn>>(int num_inserts)

{
  int iVar1;
  int stride;
  int map_size;
  uint i;
  int in_stack_000000bc;
  int in_stack_000000c0;
  int in_stack_000000c4;
  int local_10;
  uint local_8;
  
  for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
    iVar1 = stresshashfunction<EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn>_>::kMapSizes
            [local_8];
    for (local_10 = 1; local_10 <= iVar1; local_10 = iVar1 * local_10) {
      stresshashfunction<EasyUseSparseHashMap<HashObject<8,8>*,int,HashFn>>
                (in_stack_000000c4,in_stack_000000c0,in_stack_000000bc);
    }
  }
  return;
}

Assistant:

static void stresshashfunction(int num_inserts) {
  static const int kMapSizes[] = {256, 1024};
  for (unsigned i = 0; i < sizeof(kMapSizes) / sizeof(kMapSizes[0]); i++) {
    const int map_size = kMapSizes[i];
    for (int stride = 1; stride <= map_size; stride *= map_size) {
      stresshashfunction<MapType>(num_inserts, map_size, stride);
    }
  }
}